

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

string * __thiscall pbrt::LightBase::BaseToString_abi_cxx11_(LightBase *this)

{
  string *in_RDI;
  Transform *in_stack_00000010;
  MediumInterface *in_stack_00000018;
  LightType *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::LightType_const&,pbrt::MediumInterface_const&,pbrt::Transform_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string LightBase::BaseToString() const {
    return StringPrintf("type: %s mediumInterface: %s renderFromLight: %s", type,
                        mediumInterface, renderFromLight);
}